

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O2

void __thiscall
dg::DODRanganath::coloredDAG
          (DODRanganath *this,CDGraph *graph,CDNode *n,
          set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *visited)

{
  pointer ppCVar1;
  CDNode *pCVar2;
  mapped_type *pmVar3;
  Color CVar4;
  const_iterator __begin3;
  pointer ppCVar5;
  pair<std::_Rb_tree_iterator<dg::CDNode_*>,_bool> pVar6;
  CDNode *n_local;
  CDNode *q;
  CDNode *s;
  
  n_local = n;
  pVar6 = std::
          _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
          ::_M_insert_unique<dg::CDNode*const&>
                    ((_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                      *)visited,&n_local);
  pCVar2 = n_local;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ppCVar5 = (n_local->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar1 = (n_local->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar5 != ppCVar1) {
      for (; ppCVar5 != ppCVar1; ppCVar5 = ppCVar5 + 1) {
        coloredDAG(this,graph,*ppCVar5,visited);
      }
      s = *(pCVar2->super_ElemWithEdges<dg::CDNode>)._successors.
           super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      pmVar3 = std::__detail::
               _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&s);
      CVar4 = pmVar3->color;
      ppCVar5 = (pCVar2->super_ElemWithEdges<dg::CDNode>)._successors.
                super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar1 = (pCVar2->super_ElemWithEdges<dg::CDNode>)._successors.
                super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      do {
        if (ppCVar5 == ppCVar1) goto LAB_0011da4d;
        q = *ppCVar5;
        pmVar3 = std::__detail::
                 _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this,&q);
        ppCVar5 = ppCVar5 + 1;
      } while (pmVar3->color == CVar4);
      CVar4 = UNCOLORED;
LAB_0011da4d:
      pmVar3 = std::__detail::
               _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&n_local);
      pmVar3->color = CVar4;
    }
  }
  return;
}

Assistant:

void coloredDAG(CDGraph &graph, CDNode *n, std::set<CDNode *> &visited) {
        if (visited.insert(n).second) {
            const auto &successors = n->successors();
            if (successors.empty())
                return;

            for (auto *q : successors) {
                coloredDAG(graph, q, visited);
            }
            auto *s = *(successors.begin());
            auto c = data[s].color;
            for (auto *q : successors) {
                if (data[q].color != c) {
                    c = Color::UNCOLORED;
                    break;
                }
            }
            data[n].color = c;
        }
    }